

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<2,152>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<2,152> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double awr;
  undefined8 uVar1;
  long lVar2;
  double dVar3;
  ListRecord local_78;
  
  dVar3 = *(double *)(head + 0x28);
  awr = *(double *)(head + 0x20);
  uVar1 = *(undefined8 *)head;
  lVar2 = *(long *)(head + 0x18);
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_78,begin,end,lineNumber,*(int *)(head + 0x30),2,0x98);
  dVar3 = round(dVar3);
  Type<2,_152>::Type((Type<2,_152> *)this,(int)dVar3,awr,lVar2 != 0,(int)uVar1,&local_78);
  if (local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BaseWithoutMT<njoy::ENDFtk::section::Type<2,152>>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,2);
  return;
}

Assistant:

Type ( const HEAD& head,
       Iterator& begin,
       const Iterator& end,
       long& lineNumber,
       int MAT )
  try:
    Type( head.ZA(), head.AWR(), head.L1(), head.N2(),
          ListRecord( begin, end, lineNumber, head.MAT(), 2, 152 ) ) {

      readSEND( begin, end, lineNumber, MAT, 2 );
  } catch( std::exception& e ){
    Log::info( "Trouble while reading section 152 of File 2 of Material {}",
               MAT );
    throw e;
  }